

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

bool flatbuffers::java::SaveClass(Parser *parser,Definition *def,string *classcode,string *path)

{
  bool bVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string code;
  string name_space_dir;
  string name_space_java;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Definition *local_e0;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (classcode->_M_string_length == 0) {
    bVar1 = true;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_e0 = def;
    local_d8 = classcode;
    std::__cxx11::string::string((string *)&local_90,(string *)path);
    for (pbVar2 = (parser->name_space_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 != (parser->name_space_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      if (local_70._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_70);
        std::__cxx11::string::append((char *)&local_90);
      }
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::append((string *)&local_90);
      mkdir(local_90._M_dataplus._M_p,0x1ed);
    }
    std::__cxx11::string::string
              ((string *)&local_b0,"// automatically generated, do not modify\n\n",
               (allocator *)&local_100);
    std::operator+(&local_d0,"package ",&local_70);
    std::operator+(&local_100,&local_d0,";\n\n");
    std::__cxx11::string::append((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::append((char *)&local_b0);
    std::__cxx11::string::append((char *)&local_b0);
    std::__cxx11::string::append((string *)&local_b0);
    std::operator+(&local_50,&local_90,"/");
    std::operator+(&local_d0,&local_50,&local_e0->name);
    std::operator+(&local_100,&local_d0,".java");
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = SaveFile(local_100._M_dataplus._M_p,&local_b0,false);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return bVar1;
}

Assistant:

static bool SaveClass(const Parser &parser, const Definition &def,
                      const std::string &classcode, const std::string &path) {
  if (!classcode.length()) return true;

  std::string name_space_java;
  std::string name_space_dir = path;
  for (auto it = parser.name_space_.begin();
        it != parser.name_space_.end(); ++it) {
    if (name_space_java.length()) {
      name_space_java += ".";
      name_space_dir += PATH_SEPARATOR;
    }
    name_space_java += *it;
    name_space_dir += *it;
    mkdir(name_space_dir.c_str(), S_IRWXU|S_IRGRP|S_IXGRP|S_IROTH|S_IXOTH);
  }

  std::string code = "// automatically generated, do not modify\n\n";
  code += "package " + name_space_java + ";\n\n";
  code += "import java.nio.*;\nimport java.lang.*;\nimport java.util.*;\n";
  code += "import flatbuffers.*;\n\n";
  code += classcode;
  auto filename = name_space_dir + PATH_SEPARATOR + def.name + ".java";
  return SaveFile(filename.c_str(), code, false);
}